

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  cmake *this_00;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  _Elt_pointer ptVar6;
  char *pcVar7;
  size_t sVar8;
  undefined8 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ostream *poVar11;
  long *plVar12;
  undefined7 in_register_00000009;
  ulong *puVar13;
  Internals *pIVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint uVar18;
  byte *pbVar19;
  byte bVar20;
  t_domain tVar21;
  cmListFileContext lfc;
  string result;
  string varresult;
  stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> openstack;
  cmOutputConverter converter;
  ostringstream ostr;
  allocator local_361;
  cmMakefile *local_360;
  string *local_358;
  string local_350;
  undefined1 local_330 [32];
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  long local_2f0;
  MessageType local_2e8;
  allocator local_2e2;
  allocator local_2e1;
  undefined1 *local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined7 uStack_2cf;
  undefined4 local_2bc;
  t_lookup local_2b8;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  long local_298;
  ulong local_290;
  string local_288;
  _Deque_base<t_lookup,_std::allocator<t_lookup>_> local_268;
  undefined4 local_210;
  undefined4 local_20c;
  string *local_208;
  string local_200;
  Snapshot *local_1e0;
  RegularExpression *local_1d8;
  cmState *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  Internals local_198 [3];
  ios_base local_138 [264];
  
  local_210 = CONCAT31(in_register_00000089,atOnly);
  local_20c = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_2bc = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pbVar17 = (byte *)(source->_M_dataplus)._M_p;
  local_2e0 = &local_2d0;
  local_2d8 = (char *)0x0;
  local_2d0 = 0;
  local_360 = this;
  local_358 = errorstr;
  local_208 = source;
  std::__cxx11::string::reserve((ulong)&local_2e0);
  local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<t_lookup,_std::allocator<t_lookup>_>::_M_initialize_map(&local_268,0);
  local_1a8._0_8_ = (ulong)(uint)local_1a8._4_4_ << 0x20;
  local_1a8._8_8_ = 0;
  if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_268._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<t_lookup,_std::allocator<t_lookup>_>::_M_push_back_aux<t_lookup>
              ((deque<t_lookup,_std::allocator<t_lookup>_> *)&local_268,(t_lookup *)local_1a8);
  }
  else {
    *(undefined8 *)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1a8._0_8_;
    (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur)->loc = 0;
    local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_268._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_298 = line;
  local_1d0 = local_360->LocalGenerator->GlobalGenerator->CMakeInstance->State;
  bVar20 = *pbVar17;
  local_1d8 = &local_360->cmNamedCurly;
  local_1e0 = &local_360->StateSnapshot;
  local_2e8 = LOG;
  local_290 = 0;
  pbVar19 = pbVar17;
  do {
    if (bVar20 < 0x40) {
      if (bVar20 == 10) {
        local_298 = local_298 + 1;
      }
      else {
        if (bVar20 != 0x24) {
          if (bVar20 != 0) goto LAB_00329a7a;
          if ((local_290 & 1) != 0) goto LAB_0032a73b;
          break;
        }
        if ((char)local_210 != '\0') goto LAB_00329893;
        local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
        local_2b8.loc = 0;
        pbVar16 = pbVar17 + 1;
        bVar20 = pbVar17[1];
        if (bVar20 == 0) {
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          pbVar19 = pbVar16;
        }
        else if (bVar20 != 0x3c) {
          if (bVar20 == 0x7b) {
            pbVar16 = pbVar17 + 2;
          }
          else {
            iVar4 = strncmp((char *)pbVar16,"ENV{",4);
            if (iVar4 == 0) {
              pbVar16 = pbVar17 + 5;
              local_2b8.domain = 1;
            }
            else {
              iVar4 = strncmp((char *)pbVar16,"CACHE{",6);
              if (iVar4 != 0) {
                bVar2 = cmsys::RegularExpression::find(local_1d8,(char *)pbVar16);
                if (bVar2) {
                  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_350,pbVar16,
                             pbVar16 + ((long)(local_360->cmNamedCurly).endp[0] -
                                       (long)(local_360->cmNamedCurly).searchstring));
                  plVar12 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_350,0,(char *)0x0,0x594439);
                  puVar13 = (ulong *)(plVar12 + 2);
                  if ((ulong *)*plVar12 == puVar13) {
                    local_330._16_8_ = *puVar13;
                    local_330._24_8_ = plVar12[3];
                    local_330._0_8_ = local_330 + 0x10;
                  }
                  else {
                    local_330._16_8_ = *puVar13;
                    local_330._0_8_ = (ulong *)*plVar12;
                  }
                  local_330._8_8_ = plVar12[1];
                  *plVar12 = (long)puVar13;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  plVar12 = (long *)std::__cxx11::string::append(local_330);
                  pIVar14 = (Internals *)(plVar12 + 2);
                  if ((Internals *)*plVar12 == pIVar14) {
                    local_198[0].VarStack.
                    super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
                    super__List_node_base._M_next =
                         (pIVar14->VarStack).
                         super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                         _M_node.super__List_node_base._M_next;
                    local_198[0].VarStack.
                    super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
                    super__List_node_base._M_prev = (_List_node_base *)plVar12[3];
                    local_1a8._0_8_ = (Internals *)(local_1a8 + 0x10);
                  }
                  else {
                    local_198[0].VarStack.
                    super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
                    super__List_node_base._M_next =
                         (pIVar14->VarStack).
                         super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                         _M_node.super__List_node_base._M_next;
                    local_1a8._0_8_ = (Internals *)*plVar12;
                  }
                  local_1a8._8_8_ = plVar12[1];
                  *plVar12 = (long)pIVar14;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  std::__cxx11::string::operator=((string *)local_358,(string *)local_1a8);
                  if ((Internals *)local_1a8._0_8_ != (Internals *)(local_1a8 + 0x10)) {
                    operator_delete((void *)local_1a8._0_8_,
                                    (long)local_198[0].VarStack.
                                          super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>
                                          ._M_impl._M_node.super__List_node_base._M_next + 1);
                  }
                  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  paVar10 = &local_350.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p != paVar10) {
                    operator_delete(local_350._M_dataplus._M_p,
                                    local_350.field_2._M_allocated_capacity + 1);
                    paVar10 = extraout_RAX;
                  }
                  local_2e8 = FATAL_ERROR;
                  local_290 = CONCAT71((int7)((ulong)paVar10 >> 8),1);
                }
                goto LAB_00329d6f;
              }
              pbVar16 = pbVar17 + 7;
              local_2b8.domain = 2;
            }
          }
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          local_2b8.loc = (size_t)local_2d8;
          pbVar17 = pbVar16 + -1;
          pbVar19 = pbVar16;
          if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_268._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<t_lookup,std::allocator<t_lookup>>::_M_push_back_aux<t_lookup_const&>
                      ((deque<t_lookup,std::allocator<t_lookup>> *)&local_268,&local_2b8);
          }
          else {
            (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur)->domain = local_2b8.domain;
            *(undefined4 *)&(local_268._M_impl.super__Deque_impl_data._M_finish._M_cur)->field_0x4 =
                 local_2b8._4_4_;
            (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur)->loc = (size_t)local_2d8;
            local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_268._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
    }
    else if (bVar20 == 0x40) {
      if (replaceAt) {
        pbVar16 = pbVar17 + 1;
        pbVar5 = (byte *)strchr((char *)pbVar16,0x40);
        if ((pbVar5 != pbVar16 && pbVar5 != (byte *)0x0) &&
           (sVar8 = strspn((char *)pbVar16,
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pbVar5 == pbVar16 + sVar8)) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pbVar16,pbVar16 + ~(ulong)pbVar17 + (long)pbVar5);
          pcVar7 = GetDefinition(local_360,(string *)local_1a8);
          if (pcVar7 == (char *)0x0) {
            pcVar7 = "";
          }
          std::__cxx11::string::string((string *)local_330,pcVar7,(allocator *)&local_350);
          if ((char)local_2bc != '\0') {
            cmSystemTools::EscapeQuotes(&local_350,(string *)local_330);
            std::__cxx11::string::operator=((string *)local_330,(string *)&local_350);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          std::__cxx11::string::_M_append((char *)&local_2e0,local_330._0_8_);
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if ((Internals *)local_1a8._0_8_ != (Internals *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,
                            (long)local_198[0].VarStack.
                                  super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
                                  _M_impl._M_node.super__List_node_base._M_next + 1);
          }
          pbVar17 = pbVar5;
          pbVar19 = pbVar5 + 1;
          goto LAB_00329d6f;
        }
      }
LAB_00329a7a:
      if ((1 < ((long)local_268._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_268._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_268._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
               + (ulong)(local_268._M_impl.super__Deque_impl_data._M_finish._M_node ==
                        (_Map_pointer)0x0)) * 0x20) &&
         (iVar4 = isalnum((int)(char)bVar20), iVar4 == 0)) {
        uVar18 = bVar20 - 0x2b;
        if ((0x34 < uVar18) || ((0x1000000000001dU >> ((ulong)uVar18 & 0x3f) & 1) == 0)) {
          std::__cxx11::string::append((char *)local_358);
          std::__cxx11::string::push_back((char)local_358);
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          std::__cxx11::string::substr((ulong)&local_350,(ulong)&local_2e0);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,0x59450e);
          puVar13 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar13) {
            local_330._16_8_ = *puVar13;
            local_330._24_8_ = plVar12[3];
            local_330._0_8_ = local_330 + 0x10;
          }
          else {
            local_330._16_8_ = *puVar13;
            local_330._0_8_ = (ulong *)*plVar12;
          }
          local_330._8_8_ = plVar12[1];
          *plVar12 = (long)puVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append(local_330);
          pIVar14 = (Internals *)(plVar12 + 2);
          if ((Internals *)*plVar12 == pIVar14) {
            local_198[0].VarStack.super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
            _M_impl._M_node.super__List_node_base._M_next =
                 (pIVar14->VarStack).super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
            local_198[0].VarStack.super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
            _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar12[3];
            local_1a8._0_8_ = (Internals *)(local_1a8 + 0x10);
          }
          else {
            local_198[0].VarStack.super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
            _M_impl._M_node.super__List_node_base._M_next =
                 (pIVar14->VarStack).super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
            local_1a8._0_8_ = (Internals *)*plVar12;
          }
          local_1a8._8_8_ = plVar12[1];
          *plVar12 = (long)pIVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_358,local_1a8._0_8_);
          if ((Internals *)local_1a8._0_8_ != (Internals *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,
                            (long)local_198[0].VarStack.
                                  super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
                                  _M_impl._M_node.super__List_node_base._M_next + 1);
          }
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0032a73b;
        }
      }
    }
    else if (bVar20 == 0x5c) {
LAB_00329893:
      if ((char)local_20c != '\0') goto LAB_00329d6f;
      bVar20 = pbVar17[1];
      if (bVar20 < 0x72) {
        if (bVar20 == 0x3b) {
          if (((long)local_268._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_268._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_268._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_268._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x20 == 1) goto LAB_00329d62;
        }
        else if (bVar20 == 0x6e) {
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          std::__cxx11::string::append((char *)&local_2e0);
          goto LAB_00329d5e;
        }
LAB_00329cfe:
        iVar4 = isalnum((int)(char)bVar20);
        if ((bVar20 == 0) || (iVar4 != 0)) {
          uVar9 = std::__cxx11::string::append((char *)local_358);
          if (bVar20 != 0) {
            uVar9 = std::__cxx11::string::push_back((char)local_358);
          }
          local_290 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
          std::__cxx11::string::append((char *)local_358);
        }
        else {
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          pbVar19 = pbVar17 + 1;
        }
      }
      else {
        if (bVar20 == 0x72) {
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          std::__cxx11::string::append((char *)&local_2e0);
        }
        else {
          if (bVar20 != 0x74) goto LAB_00329cfe;
          std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
          std::__cxx11::string::append((char *)&local_2e0);
        }
LAB_00329d5e:
        pbVar19 = pbVar17 + 2;
      }
LAB_00329d62:
      if (*pbVar19 != 0) {
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
      if (bVar20 != 0x7d) goto LAB_00329a7a;
      if (((long)local_268._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
          ((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_268._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
          ((((ulong)((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_268._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(local_268._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
          * 0x20 < 2) goto LAB_00329d6f;
      if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
        tVar21 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].domain;
        uVar15 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].loc;
        operator_delete(local_268._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_268._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_268._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_268._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
        ptVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
        local_268._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_268._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        ptVar6 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        tVar21 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].domain;
        uVar15 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].loc;
      }
      local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = ptVar6;
      std::__cxx11::string::append((char *)&local_2e0,(ulong)pbVar19);
      std::__cxx11::string::substr((ulong)&local_350,(ulong)&local_2e0);
      local_2b8._0_8_ = &local_2a8;
      local_2b8.loc = 0;
      local_2a8 = 0;
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                       ::lineVar_abi_cxx11_), iVar4 != 0)) {
        ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
        ::lineVar_abi_cxx11_._M_dataplus._M_p =
             (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                       ::lineVar_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      puVar13 = (ulong *)(local_330 + 0x10);
      if (tVar21 == NORMAL) {
        if (((filename == (char *)0x0) ||
            (local_350._M_string_length !=
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_._M_string_length)) ||
           ((local_350._M_string_length != 0 &&
            (iVar4 = bcmp(local_350._M_dataplus._M_p,
                          ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                          ::lineVar_abi_cxx11_._M_dataplus._M_p,local_350._M_string_length),
            iVar4 != 0)))) {
          pcVar7 = GetDefinition(local_360,&local_350);
          goto LAB_00329ed6;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<long>((long)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_330);
        if ((ulong *)local_330._0_8_ != puVar13) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
LAB_0032a0ff:
        if ((!removeEmpty) &&
           (local_360->LocalGenerator->GlobalGenerator->CMakeInstance->WarnUninitialized == true)) {
          local_1a8._0_8_ = (local_360->Internal).x_;
          local_330._0_8_ =
               (((Internals *)local_1a8._0_8_)->VarStack).
               super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
               super__List_node_base._M_next;
          bVar2 = cmDefinitions::HasKey
                            (&local_350,(StackConstIter *)local_1a8,(StackConstIter *)local_330);
          if (!bVar2) {
            if (local_360->CheckSystemVars == false) {
              std::__cxx11::string::string((string *)local_1a8,filename,(allocator *)&local_1c8);
              pcVar7 = cmake::GetHomeDirectory
                                 (local_360->LocalGenerator->GlobalGenerator->CMakeInstance);
              std::__cxx11::string::string((string *)local_330,pcVar7,&local_361);
              bVar2 = cmsys::SystemTools::IsSubDirectory((string *)local_1a8,(string *)local_330);
              bVar3 = true;
              if (!bVar2) {
                std::__cxx11::string::string((string *)&local_200,filename,&local_2e1);
                pcVar7 = cmake::GetHomeOutputDirectory
                                   (local_360->LocalGenerator->GlobalGenerator->CMakeInstance);
                std::__cxx11::string::string((string *)&local_288,pcVar7,&local_2e2);
                bVar3 = cmsys::SystemTools::IsSubDirectory(&local_200,&local_288);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_dataplus._M_p != &local_200.field_2) {
                  operator_delete(local_200._M_dataplus._M_p,
                                  local_200.field_2._M_allocated_capacity + 1);
                }
              }
              if ((ulong *)local_330._0_8_ != puVar13) {
                operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
              }
              if ((Internals *)local_1a8._0_8_ != (Internals *)(local_1a8 + 0x10)) {
                operator_delete((void *)local_1a8._0_8_,
                                (long)local_198[0].VarStack.
                                      super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>
                                      ._M_impl._M_node.super__List_node_base._M_next + 1);
              }
              if (bVar3 == false) goto LAB_0032a4a7;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            local_330._8_8_ = 0;
            local_330._16_8_ = local_330._16_8_ & 0xffffffffffffff00;
            local_310._M_p = (pointer)&local_300;
            local_308 = 0;
            local_300._M_local_buf[0] = '\0';
            local_2f0 = 0;
            local_330._0_8_ = puVar13;
            cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_200,*local_1e0);
            std::__cxx11::string::string((string *)&local_1c8,filename,&local_361);
            cmOutputConverter::Convert
                      (&local_288,(cmOutputConverter *)&local_200,&local_1c8,HOME,UNCHANGED);
            std::__cxx11::string::operator=((string *)&local_310,(string *)&local_288);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            local_2f0 = local_298;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"uninitialized variable \'",0x18);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                                 local_350._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
            this_00 = local_360->LocalGenerator->GlobalGenerator->CMakeInstance;
            std::__cxx11::stringbuf::str();
            cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_288,(cmListFileContext *)local_330);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            cmListFileContext::~cmListFileContext((cmListFileContext *)local_330);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
      }
      else {
        if (tVar21 == ENVIRONMENT) {
          pcVar7 = cmsys::SystemTools::GetEnv(local_350._M_dataplus._M_p);
        }
        else {
          if (tVar21 != CACHE) goto LAB_0032a0ff;
          pcVar7 = cmState::GetCacheEntryValue(local_1d0,&local_350);
        }
LAB_00329ed6:
        sVar1 = local_2b8.loc;
        if (pcVar7 == (char *)0x0) goto LAB_0032a0ff;
        if ((char)local_2bc == '\0') {
          strlen(pcVar7);
          std::__cxx11::string::_M_replace((ulong)&local_2b8,0,(char *)sVar1,(ulong)pcVar7);
        }
        else {
          local_330._0_8_ = puVar13;
          sVar8 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_330,pcVar7,pcVar7 + sVar8)
          ;
          cmSystemTools::EscapeQuotes((string *)local_1a8,(string *)local_330);
          std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_1a8);
          if ((Internals *)local_1a8._0_8_ != (Internals *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,
                            (long)local_198[0].VarStack.
                                  super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
                                  _M_impl._M_node.super__List_node_base._M_next + 1);
          }
          if ((ulong *)local_330._0_8_ != puVar13) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
        }
      }
LAB_0032a4a7:
      std::__cxx11::string::replace((ulong)&local_2e0,uVar15,local_2d8 + -uVar15,local_2b8._0_8_);
      if ((undefined1 *)local_2b8._0_8_ != &local_2a8) {
        operator_delete((void *)local_2b8._0_8_,CONCAT71(uStack_2a7,local_2a8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      pbVar19 = pbVar17 + 1;
    }
LAB_00329d6f:
    if ((local_290 & 1) != 0) goto LAB_0032a73b;
    bVar20 = pbVar17[1];
    pbVar17 = pbVar17 + 1;
  } while (bVar20 != 0);
  if (((long)local_268._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)local_268._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_node -
                (long)local_268._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(local_268._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
      0x20 == 1) {
    std::__cxx11::string::append((char *)&local_2e0);
    std::__cxx11::string::_M_assign((string *)local_208);
  }
  else {
    std::__cxx11::string::append((char *)local_358);
LAB_0032a73b:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      sVar8 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar11 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_208->_M_dataplus)._M_p,
                         local_208->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_358->_M_dataplus)._M_p,local_358->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_358,(string *)local_330);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_2e8 = FATAL_ERROR;
  }
  std::_Deque_base<t_lookup,_std::allocator<t_lookup>_>::~_Deque_base(&local_268);
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT71(uStack_2cf,local_2d0) + 1);
  }
  return local_2e8;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::stack<t_lookup> openstack;
  bool error = false;
  bool done = false;
  openstack.push(t_lookup());
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(openstack.size() > 1)
          {
          t_lookup var = openstack.top();
          openstack.pop();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.size() == 1)
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(openstack.size() > 1 &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.top().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && openstack.size() != 1)
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}